

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_compat.c
# Opt level: O3

char * old_create_multityped_action_spec
                 (CMFormatList *input_format_lists,CMFormatList out_format_list,char *function)

{
  undefined8 *puVar1;
  long *plVar2;
  FMFieldList p_Var3;
  char **ppcVar4;
  int iVar5;
  FMStructDescList *input_format_lists_00;
  CMFormatList pCVar6;
  FMStructDescList p_Var7;
  CMFormatList pCVar8;
  void *pvVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  CMFormatList pCVar14;
  uint uVar15;
  long lVar16;
  
  lVar16 = 1;
  uVar12 = 0;
  do {
    lVar16 = lVar16 + -1;
    plVar2 = (long *)((long)input_format_lists + uVar12);
    uVar12 = uVar12 + 8;
  } while (*plVar2 != 0);
  pCVar14 = out_format_list;
  input_format_lists_00 = (FMStructDescList *)INT_CMmalloc(uVar12 & 0x7fffffff8);
  if (lVar16 != 0) {
    lVar11 = 0;
    do {
      pCVar8 = input_format_lists[lVar11];
      uVar15 = 0;
      if (pCVar8 != (CMFormatList)0x0) {
        uVar15 = 0xffffffff;
        pCVar6 = pCVar8;
        do {
          uVar15 = uVar15 + 1;
          ppcVar4 = &pCVar6->format_name;
          pCVar6 = pCVar6 + 1;
        } while (*ppcVar4 != (char *)0x0);
      }
      uVar12 = (ulong)uVar15;
      p_Var7 = (FMStructDescList)INT_CMmalloc(uVar12 * 0x20 + 0x20);
      if (uVar15 == 0) {
        uVar12 = 0;
      }
      else {
        lVar13 = 0;
        do {
          *(undefined8 *)((long)&p_Var7->format_name + lVar13 * 2) =
               *(undefined8 *)((long)&pCVar8->format_name + lVar13);
          p_Var3 = *(FMFieldList *)((long)&pCVar8->field_list + lVar13);
          *(FMFieldList *)((long)&p_Var7->field_list + lVar13 * 2) = p_Var3;
          iVar5 = struct_size_field_list(p_Var3,(int)pCVar14);
          *(int *)((long)&p_Var7->struct_size + lVar13 * 2) = iVar5;
          *(undefined8 *)((long)&p_Var7->opt_info + lVar13 * 2) = 0;
          lVar13 = lVar13 + 0x10;
        } while (uVar12 << 4 != lVar13);
      }
      p_Var7[uVar12].format_name = (char *)0x0;
      p_Var7[uVar12].field_list = (FMFieldList)0x0;
      input_format_lists_00[lVar11] = p_Var7;
      lVar11 = lVar11 + 1;
    } while (-lVar16 != lVar11);
  }
  if (out_format_list == (CMFormatList)0x0) {
    uVar15 = 0;
  }
  else {
    uVar15 = 0xffffffff;
    pCVar8 = out_format_list;
    do {
      uVar15 = uVar15 + 1;
      ppcVar4 = &pCVar8->format_name;
      pCVar8 = pCVar8 + 1;
    } while (*ppcVar4 != (char *)0x0);
  }
  uVar12 = (ulong)uVar15;
  pvVar9 = INT_CMmalloc(uVar12 * 0x20 + 0x20);
  if (uVar15 == 0) {
    uVar12 = 0;
  }
  else {
    lVar16 = 0;
    do {
      *(undefined8 *)((long)pvVar9 + lVar16 * 2) =
           *(undefined8 *)((long)&out_format_list->format_name + lVar16);
      p_Var3 = *(FMFieldList *)((long)&out_format_list->field_list + lVar16);
      *(FMFieldList *)((long)pvVar9 + lVar16 * 2 + 8) = p_Var3;
      iVar5 = struct_size_field_list(p_Var3,(int)pCVar14);
      *(int *)((long)pvVar9 + lVar16 * 2 + 0x10) = iVar5;
      *(undefined8 *)((long)pvVar9 + lVar16 * 2 + 0x18) = 0;
      lVar16 = lVar16 + 0x10;
    } while (uVar12 << 4 != lVar16);
  }
  puVar1 = (undefined8 *)((long)pvVar9 + uVar12 * 0x20);
  *puVar1 = 0;
  puVar1[1] = 0;
  pcVar10 = create_multityped_action_spec(input_format_lists_00,function);
  return pcVar10;
}

Assistant:

extern char*
old_create_multityped_action_spec(CMFormatList *input_format_lists, CMFormatList out_format_list, char *function)
{
    FMStructDescList structs, out_structs, *struct_list;
    int struct_count = 0, j;
    int count, i;
    while (input_format_lists[struct_count] != NULL) struct_count++;
    struct_list = malloc(sizeof(struct_list[0]) * (struct_count+1));
    for (j = 0; j < struct_count ; j++) {
	CMFormatList format_list = input_format_lists[j];
	count = 0;
	while (format_list && (format_list[count].format_name != NULL)) count++;
	structs = malloc(sizeof(structs[0]) * (count + 1));
	for (i = 0; i < count; i++) {
	    structs[i].format_name = format_list[i].format_name;
	    structs[i].field_list = format_list[i].field_list;
	    structs[i].struct_size = struct_size_field_list(structs[i].field_list, (int)sizeof(char*));
	    structs[i].opt_info = NULL;
	}
	structs[count].format_name = NULL;
	structs[count].field_list = NULL;
	struct_list[j] = structs;
    }

    count = 0;
    while (out_format_list && (out_format_list[count].format_name != NULL)) count++;
    out_structs = malloc(sizeof(out_structs[0]) * (count + 1));
    for (i = 0; i < count; i++) {
	out_structs[i].format_name = out_format_list[i].format_name;
	out_structs[i].field_list = out_format_list[i].field_list;
	out_structs[i].struct_size = struct_size_field_list(out_structs[i].field_list, (int)sizeof(char*));
	out_structs[i].opt_info = NULL;
    }
    out_structs[count].format_name = NULL;
    out_structs[count].field_list = NULL;
    return create_multityped_action_spec(struct_list, function);
}